

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::log_assert(JUnitReporter *this,AssertData *rb)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  char *local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream os;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  AssertData *rb_local;
  JUnitReporter *this_local;
  
  if ((rb->m_failed & 1U) != 0) {
    lock._M_device = (mutex_type *)rb;
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
    std::__cxx11::ostringstream::ostringstream(local_198);
    pcVar2 = skipPathFromFilename
                       (*(char **)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 0x10));
    poVar3 = std::operator<<((ostream *)local_198,pcVar2);
    if ((this->opt->gnu_file_line & 1U) == 0) {
      local_238 = "(";
    }
    else {
      local_238 = ":";
    }
    poVar3 = std::operator<<(poVar3,local_238);
    uVar1 = line(this,*(uint *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 0x18));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
    pcVar2 = "):";
    if ((this->opt->gnu_file_line & 1U) != 0) {
      pcVar2 = ":";
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    fulltext_log_assert_to_stream((ostream *)local_198,(AssertData *)lock._M_device);
    log_contexts(this,(ostringstream *)local_198);
    pcVar2 = String::c_str((String *)
                           &lock._M_device[1].super___mutex_base._M_mutex.__data.__list.__next);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,pcVar2,&local_1c9);
    pcVar2 = assertString(((lock._M_device)->super___mutex_base)._M_mutex.__data.__owner);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar2,&local_1f1);
    std::__cxx11::ostringstream::str();
    JUnitTestCaseData::addFailure(&this->testCaseData,&local_1c8,&local_1f0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed) // report only failures & ignore the `success` option
                return;

            std::lock_guard<std::mutex> lock(mutex);

            std::ostringstream os;
            os << skipPathFromFilename(rb.m_file) << (opt.gnu_file_line ? ":" : "(")
              << line(rb.m_line) << (opt.gnu_file_line ? ":" : "):") << std::endl;

            fulltext_log_assert_to_stream(os, rb);
            log_contexts(os);
            testCaseData.addFailure(rb.m_decomp.c_str(), assertString(rb.m_at), os.str());
        }